

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetTargetEntityID(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT16 *pKVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 1) == 0) {
    (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag | 1;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 4;
  }
  KVar2 = ID->m_ui8ApplicationID;
  KVar3 = ID->m_ui16EntityID;
  (this->m_TargetID).m_ui8SiteID = ID->m_ui8SiteID;
  (this->m_TargetID).m_ui8ApplicationID = KVar2;
  (this->m_TargetID).m_ui16EntityID = KVar3;
  return;
}

Assistant:

void LE_Detonation_PDU::SetTargetEntityIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8TargetId )return;

    m_DetonationFlag1Union.m_ui8TargetId = F;

    if( F )
    {
        m_ui16PDULength += LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
}